

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

Client * __thiscall
capnp::Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>
          (Client *__return_storage_ptr__,Client *this)

{
  ClientHook *pCVar1;
  Own<capnp::ClientHook> local_28;
  Client *local_18;
  Client *this_local;
  
  local_18 = this;
  this_local = (Client *)__return_storage_ptr__;
  pCVar1 = kj::Own<capnp::ClientHook>::operator->(&this->hook);
  (*pCVar1->_vptr_ClientHook[4])();
  capnproto_test::capnp::test::TestMoreStuff::Client::Client(__return_storage_ptr__,&local_28);
  kj::Own<capnp::ClientHook>::~Own(&local_28);
  return __return_storage_ptr__;
}

Assistant:

inline typename T::Client Capability::Client::castAs() {
  return typename T::Client(hook->addRef());
}